

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

char * run_len_encode(char *p,uint64_t i)

{
  for (; 0x7f < i; i = i >> 7) {
    *p = (byte)i | 0x80;
    p = (char *)((byte *)p + 1);
  }
  *p = (byte)i;
  return (char *)((byte *)p + 1);
}

Assistant:

inline char* run_len_encode(char* p, uint64_t i)
{
  // store an int 7 bits at a time.
  while (i >= 128)
  {
    *(p++) = (i & 127) | 128;
    i = i >> 7;
  }
  *(p++) = (i & 127);
  return p;
}